

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

ExprBase * AnalyzeStatement(ExpressionContext *ctx,SynBase *syntax)

{
  bool bVar1;
  int iVar2;
  ExprSwitch *pEVar3;
  ExprSwitch *expr;
  undefined4 extraout_var;
  TypeBase *pTVar4;
  SynReturn *syntax_00;
  SynYield *syntax_01;
  SynVariableDefinitions *syntax_02;
  SynFunctionDefinition *syntax_03;
  SynClassDefinition *syntax_04;
  SynClassPrototype *syntax_05;
  SynEnumDefinition *syntax_06;
  SynNamespaceDefinition *syntax_07;
  SynTypedef *syntax_08;
  SynIfElse *syntax_09;
  SynFor *syntax_10;
  SynForEach *syntax_11;
  SynWhile *syntax_12;
  SynDoWhile *syntax_13;
  SynSwitch *syntax_14;
  SynBreak *syntax_15;
  SynContinue *syntax_16;
  SynBlock *syntax_17;
  
  if ((syntax == (SynBase *)0x0) || (syntax_00 = (SynReturn *)syntax, syntax->typeID != 0x22)) {
    syntax_00 = (SynReturn *)0x0;
  }
  if (syntax_00 == (SynReturn *)0x0) {
    if ((syntax == (SynBase *)0x0) || (syntax_01 = (SynYield *)syntax, syntax->typeID != 0x23)) {
      syntax_01 = (SynYield *)0x0;
    }
    if (syntax_01 == (SynYield *)0x0) {
      if ((syntax == (SynBase *)0x0) ||
         (syntax_02 = (SynVariableDefinitions *)syntax, syntax->typeID != 0x34)) {
        syntax_02 = (SynVariableDefinitions *)0x0;
      }
      if (syntax_02 == (SynVariableDefinitions *)0x0) {
        if ((syntax == (SynBase *)0x0) ||
           (syntax_03 = (SynFunctionDefinition *)syntax, syntax->typeID != 0x37)) {
          syntax_03 = (SynFunctionDefinition *)0x0;
        }
        if (syntax_03 == (SynFunctionDefinition *)0x0) {
          if ((syntax == (SynBase *)0x0) ||
             (syntax_04 = (SynClassDefinition *)syntax, syntax->typeID != 0x3f)) {
            syntax_04 = (SynClassDefinition *)0x0;
          }
          if (syntax_04 == (SynClassDefinition *)0x0) {
            if ((syntax == (SynBase *)0x0) ||
               (syntax_05 = (SynClassPrototype *)syntax, syntax->typeID != 0x3c)) {
              syntax_05 = (SynClassPrototype *)0x0;
            }
            if (syntax_05 == (SynClassPrototype *)0x0) {
              if ((syntax == (SynBase *)0x0) ||
                 (syntax_06 = (SynEnumDefinition *)syntax, syntax->typeID != 0x40)) {
                syntax_06 = (SynEnumDefinition *)0x0;
              }
              if (syntax_06 == (SynEnumDefinition *)0x0) {
                if ((syntax == (SynBase *)0x0) ||
                   (syntax_07 = (SynNamespaceDefinition *)syntax, syntax->typeID != 0x41)) {
                  syntax_07 = (SynNamespaceDefinition *)0x0;
                }
                if (syntax_07 == (SynNamespaceDefinition *)0x0) {
                  if ((syntax == (SynBase *)0x0) ||
                     (syntax_08 = (SynTypedef *)syntax, syntax->typeID != 0x16)) {
                    syntax_08 = (SynTypedef *)0x0;
                  }
                  if (syntax_08 == (SynTypedef *)0x0) {
                    if ((syntax == (SynBase *)0x0) ||
                       (syntax_09 = (SynIfElse *)syntax, syntax->typeID != 0x27)) {
                      syntax_09 = (SynIfElse *)0x0;
                    }
                    if (syntax_09 == (SynIfElse *)0x0) {
                      if ((syntax == (SynBase *)0x0) ||
                         (syntax_10 = (SynFor *)syntax, syntax->typeID != 0x28)) {
                        syntax_10 = (SynFor *)0x0;
                      }
                      if (syntax_10 == (SynFor *)0x0) {
                        if ((syntax == (SynBase *)0x0) ||
                           (syntax_11 = (SynForEach *)syntax, syntax->typeID != 0x2a)) {
                          syntax_11 = (SynForEach *)0x0;
                        }
                        if (syntax_11 == (SynForEach *)0x0) {
                          if ((syntax == (SynBase *)0x0) ||
                             (syntax_12 = (SynWhile *)syntax, syntax->typeID != 0x2b)) {
                            syntax_12 = (SynWhile *)0x0;
                          }
                          if (syntax_12 == (SynWhile *)0x0) {
                            if ((syntax == (SynBase *)0x0) ||
                               (syntax_13 = (SynDoWhile *)syntax, syntax->typeID != 0x2c)) {
                              syntax_13 = (SynDoWhile *)0x0;
                            }
                            if (syntax_13 == (SynDoWhile *)0x0) {
                              if ((syntax == (SynBase *)0x0) ||
                                 (syntax_14 = (SynSwitch *)syntax, syntax->typeID != 0x2e)) {
                                syntax_14 = (SynSwitch *)0x0;
                              }
                              if (syntax_14 == (SynSwitch *)0x0) {
                                if ((syntax == (SynBase *)0x0) ||
                                   (syntax_15 = (SynBreak *)syntax, syntax->typeID != 0x24)) {
                                  syntax_15 = (SynBreak *)0x0;
                                }
                                if (syntax_15 == (SynBreak *)0x0) {
                                  if ((syntax == (SynBase *)0x0) ||
                                     (syntax_16 = (SynContinue *)syntax, syntax->typeID != 0x25)) {
                                    syntax_16 = (SynContinue *)0x0;
                                  }
                                  if (syntax_16 == (SynContinue *)0x0) {
                                    if ((syntax == (SynBase *)0x0) ||
                                       (syntax_17 = (SynBlock *)syntax, syntax->typeID != 0x26)) {
                                      syntax_17 = (SynBlock *)0x0;
                                    }
                                    if (syntax_17 == (SynBlock *)0x0) {
                                      expr = (ExprSwitch *)AnalyzeExpression(ctx,syntax);
                                      bVar1 = AssertValueExpression(ctx,syntax,(ExprBase *)expr);
                                      pEVar3 = expr;
                                      if (!bVar1) {
                                        iVar2 = (*ctx->allocator->_vptr_Allocator[2])
                                                          (ctx->allocator,0x68);
                                        pEVar3 = (ExprSwitch *)CONCAT44(extraout_var,iVar2);
                                        pTVar4 = &ExpressionContext::GetErrorType(ctx)->
                                                  super_TypeBase;
                                        (pEVar3->super_ExprBase).typeID = 0;
                                        (pEVar3->super_ExprBase).source = syntax;
                                        (pEVar3->super_ExprBase).type = pTVar4;
                                        (pEVar3->super_ExprBase).next = (ExprBase *)0x0;
                                        (pEVar3->super_ExprBase).listed = false;
                                        (pEVar3->super_ExprBase)._vptr_ExprBase =
                                             (_func_int **)&PTR__ExprError_003f6638;
                                        pEVar3[1].super_ExprBase._vptr_ExprBase = (_func_int **)0x0;
                                        pEVar3->condition = (ExprBase *)&(pEVar3->cases).tail;
                                        (pEVar3->cases).head = (ExprBase *)0x400000001;
                                        (pEVar3->cases).tail = (ExprBase *)expr;
                                      }
                                    }
                                    else {
                                      pEVar3 = (ExprSwitch *)AnalyzeBlock(ctx,syntax_17,true);
                                    }
                                  }
                                  else {
                                    pEVar3 = (ExprSwitch *)AnalyzeContinue(ctx,syntax_16);
                                  }
                                }
                                else {
                                  pEVar3 = (ExprSwitch *)AnalyzeBreak(ctx,syntax_15);
                                }
                              }
                              else {
                                pEVar3 = AnalyzeSwitch(ctx,syntax_14);
                              }
                            }
                            else {
                              pEVar3 = (ExprSwitch *)AnalyzeDoWhile(ctx,syntax_13);
                            }
                          }
                          else {
                            pEVar3 = (ExprSwitch *)AnalyzeWhile(ctx,syntax_12);
                          }
                        }
                        else {
                          pEVar3 = (ExprSwitch *)AnalyzeForEach(ctx,syntax_11);
                        }
                      }
                      else {
                        pEVar3 = (ExprSwitch *)AnalyzeFor(ctx,syntax_10);
                      }
                    }
                    else {
                      pEVar3 = (ExprSwitch *)AnalyzeIfElse(ctx,syntax_09);
                    }
                  }
                  else {
                    pEVar3 = (ExprSwitch *)AnalyzeTypedef(ctx,syntax_08);
                  }
                }
                else {
                  pEVar3 = (ExprSwitch *)AnalyzeNamespaceDefinition(ctx,syntax_07);
                }
              }
              else {
                pEVar3 = (ExprSwitch *)AnalyzeEnumDefinition(ctx,syntax_06);
              }
            }
            else {
              pEVar3 = (ExprSwitch *)AnalyzeClassPrototype(ctx,syntax_05);
            }
          }
          else {
            pEVar3 = (ExprSwitch *)
                     AnalyzeClassDefinition
                               (ctx,syntax_04,(TypeGenericClassProto *)0x0,
                                (IntrusiveList<TypeHandle>)ZEXT816(0));
          }
        }
        else {
          pEVar3 = (ExprSwitch *)
                   AnalyzeFunctionDefinition
                             (ctx,syntax_03,(FunctionData *)0x0,(TypeFunction *)0x0,(TypeBase *)0x0,
                              (IntrusiveList<MatchData>)ZEXT816(0),true,false,true);
        }
      }
      else {
        pEVar3 = (ExprSwitch *)AnalyzeVariableDefinitions(ctx,syntax_02);
      }
    }
    else {
      pEVar3 = (ExprSwitch *)AnalyzeYield(ctx,syntax_01);
    }
  }
  else {
    pEVar3 = (ExprSwitch *)AnalyzeReturn(ctx,syntax_00);
  }
  return &pEVar3->super_ExprBase;
}

Assistant:

ExprBase* AnalyzeStatement(ExpressionContext &ctx, SynBase *syntax)
{
	if(SynReturn *node = getType<SynReturn>(syntax))
	{
		return AnalyzeReturn(ctx, node);
	}

	if(SynYield *node = getType<SynYield>(syntax))
	{
		return AnalyzeYield(ctx, node);
	}

	if(SynVariableDefinitions *node = getType<SynVariableDefinitions>(syntax))
	{
		return AnalyzeVariableDefinitions(ctx, node);
	}

	if(SynFunctionDefinition *node = getType<SynFunctionDefinition>(syntax))
	{
		return AnalyzeFunctionDefinition(ctx, node, NULL, NULL, NULL, IntrusiveList<MatchData>(), true, false, true);
	}

	if(SynClassDefinition *node = getType<SynClassDefinition>(syntax))
	{
		IntrusiveList<TypeHandle> generics;

		return AnalyzeClassDefinition(ctx, node, NULL, generics);
	}

	if(SynClassPrototype *node = getType<SynClassPrototype>(syntax))
	{
		return AnalyzeClassPrototype(ctx, node);
	}

	if(SynEnumDefinition *node = getType<SynEnumDefinition>(syntax))
	{
		return AnalyzeEnumDefinition(ctx, node);
	}

	if(SynNamespaceDefinition *node = getType<SynNamespaceDefinition>(syntax))
	{
		return AnalyzeNamespaceDefinition(ctx, node);
	}

	if(SynTypedef *node = getType<SynTypedef>(syntax))
	{
		return AnalyzeTypedef(ctx, node);
	}

	if(SynIfElse *node = getType<SynIfElse>(syntax))
	{
		return AnalyzeIfElse(ctx, node);
	}

	if(SynFor *node = getType<SynFor>(syntax))
	{
		return AnalyzeFor(ctx, node);
	}

	if(SynForEach *node = getType<SynForEach>(syntax))
	{
		return AnalyzeForEach(ctx, node);
	}

	if(SynWhile *node = getType<SynWhile>(syntax))
	{
		return AnalyzeWhile(ctx, node);
	}

	if(SynDoWhile *node = getType<SynDoWhile>(syntax))
	{
		return AnalyzeDoWhile(ctx, node);
	}

	if(SynSwitch *node = getType<SynSwitch>(syntax))
	{
		return AnalyzeSwitch(ctx, node);
	}

	if(SynBreak *node = getType<SynBreak>(syntax))
	{
		return AnalyzeBreak(ctx, node);
	}

	if(SynContinue *node = getType<SynContinue>(syntax))
	{
		return AnalyzeContinue(ctx, node);
	}

	if(SynBlock *node = getType<SynBlock>(syntax))
	{
		return AnalyzeBlock(ctx, node, true);
	}

	ExprBase *expression = AnalyzeExpression(ctx, syntax);

	if(!AssertValueExpression(ctx, syntax, expression))
		return new (ctx.get<ExprError>()) ExprError(syntax, ctx.GetErrorType(), expression);

	return expression;
}